

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shuffler.cpp
# Opt level: O2

ItemSource * __thiscall
WorldShuffler::place_item_randomly
          (WorldShuffler *this,Item *item,
          vector<ItemSource_*,_std::allocator<ItemSource_*>_> *possible_sources)

{
  pointer ppIVar1;
  ItemSource *source;
  bool bVar2;
  mapped_type_conflict2 *pmVar3;
  __normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_> __position;
  LandstalkerException *this_00;
  pointer ppIVar4;
  Item *item_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_d0._M_dataplus._M_p._0_1_ = item->_id;
  item_local = item;
  pmVar3 = std::
           map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
           ::operator[](&this->_item_pool_quantities,(key_type_conflict *)&local_d0);
  if (*pmVar3 == 0) {
    return (ItemSource *)0x0;
  }
  vectools::shuffle<ItemSource*>(possible_sources,&this->_rng);
  ppIVar4 = (possible_sources->super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppIVar1 = (possible_sources->super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppIVar4 == ppIVar1) {
      this_00 = (LandstalkerException *)__cxa_allocate_exception(0x28);
      std::operator+(&local_90,"Could not place ",&item->_name);
      std::operator+(&local_70,&local_90," in any of the ");
      std::__cxx11::to_string
                (&local_b0,
                 (long)(possible_sources->
                       super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(possible_sources->
                       super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>)._M_impl.
                       super__Vector_impl_data._M_start >> 3);
      std::operator+(&local_50,&local_70,&local_b0);
      std::operator+(&local_d0,&local_50," possible sources.");
      LandstalkerException::LandstalkerException(this_00,&local_d0);
      __cxa_throw(this_00,&LandstalkerException::typeinfo,
                  LandstalkerException::~LandstalkerException);
    }
    source = *ppIVar4;
    if ((source->_item == (Item *)0x0) &&
       (bVar2 = test_item_source_compatibility(this,source,item), bVar2)) break;
    ppIVar4 = ppIVar4 + 1;
  }
  (*source->_vptr_ItemSource[3])(source,item);
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<Item**,std::vector<Item*,std::allocator<Item*>>>,__gnu_cxx::__ops::_Iter_equals_val<Item*const>>
                         ((this->_item_pool).super__Vector_base<Item_*,_std::allocator<Item_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (this->_item_pool).super__Vector_base<Item_*,_std::allocator<Item_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish,&item_local);
  std::vector<Item_*,_std::allocator<Item_*>_>::erase
            (&this->_item_pool,(const_iterator)__position._M_current);
  local_d0._M_dataplus._M_p._0_1_ = item_local->_id;
  pmVar3 = std::
           map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
           ::operator[](&this->_item_pool_quantities,(key_type_conflict *)&local_d0);
  *pmVar3 = *pmVar3 - 1;
  return source;
}

Assistant:

ItemSource* WorldShuffler::place_item_randomly(Item* item, std::vector<ItemSource*> possible_sources)
{
    if(_item_pool_quantities[item->id()] == 0)
        return nullptr;

    vectools::shuffle(possible_sources, _rng);

    ItemSource* picked_item_source = nullptr;
    for(ItemSource* source : possible_sources)
    {
        if(source->empty() && test_item_source_compatibility(source, item))
        {
            source->item(item);
            picked_item_source = source;
            break;
        }
    }

    if(!picked_item_source)
    {
        throw LandstalkerException("Could not place " + item->name() + " in any of the "
                                   + std::to_string(possible_sources.size()) + " possible sources.");
    }

    _item_pool.erase(std::find(_item_pool.begin(), _item_pool.end(), item));
    _item_pool_quantities[item->id()] -= 1;
    return picked_item_source;
}